

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableVector.h
# Opt level: O3

GeometryData * __thiscall
Rml::StableVector<Rml::RenderManager::GeometryData>::erase
          (GeometryData *__return_storage_ptr__,StableVector<Rml::RenderManager::GeometryData> *this
          ,StableVectorIndex index)

{
  pointer *ppiVar1;
  pointer *ppVVar2;
  code *pcVar3;
  pointer pVVar4;
  pointer piVar5;
  bool bVar6;
  pointer pGVar7;
  ulong uVar8;
  _Bit_type *p_Var9;
  GeometryData *__old_val;
  ulong uVar10;
  
  uVar10 = (ulong)index;
  pGVar7 = (this->elements).
           super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->elements).
                 super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar7 >> 3) *
          0x6db6db6db6db6db7;
  if (uVar10 <= uVar8 && uVar8 - uVar10 != 0) {
    p_Var9 = (this->free_slots).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar8 = (ulong)(index >> 6);
    if ((p_Var9[uVar8] >> (uVar10 & 0x3f) & 1) == 0) goto LAB_00260a1a;
  }
  bVar6 = Assert("RMLUI_ASSERT(size_t(index) < elements.size() && !free_slots[size_t(index)])",
                 "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/StableVector.h"
                 ,0x5d);
  if (!bVar6) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  pGVar7 = (this->elements).
           super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var9 = (this->free_slots).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar8 = (ulong)(index >> 6);
LAB_00260a1a:
  p_Var9[uVar8] = p_Var9[uVar8] | 1L << ((byte)index & 0x3f);
  pVVar4 = *(pointer *)((long)&pGVar7[uVar10].mesh.vertices + 8);
  (__return_storage_ptr__->mesh).vertices.
  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)&pGVar7[uVar10].mesh.vertices;
  (__return_storage_ptr__->mesh).vertices.
  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVVar4;
  (__return_storage_ptr__->mesh).vertices.
  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)((long)&pGVar7[uVar10].mesh.vertices + 0x10);
  *(pointer *)((long)&pGVar7[uVar10].mesh.vertices + 0x10) = (pointer)0x0;
  *(undefined8 *)&pGVar7[uVar10].mesh.vertices = 0;
  *(pointer *)((long)&pGVar7[uVar10].mesh.vertices + 8) = (pointer)0x0;
  piVar5 = *(pointer *)((long)&pGVar7[uVar10].mesh.indices + 8);
  (__return_storage_ptr__->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       *(pointer *)&pGVar7[uVar10].mesh.indices.super__Vector_base<int,_std::allocator<int>_>;
  (__return_storage_ptr__->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar5;
  (__return_storage_ptr__->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       *(pointer *)((long)&pGVar7[uVar10].mesh.indices + 0x10);
  *(pointer *)((long)&pGVar7[uVar10].mesh.indices + 0x10) = (pointer)0x0;
  *(undefined8 *)&pGVar7[uVar10].mesh.indices.super__Vector_base<int,_std::allocator<int>_> = 0;
  *(pointer *)((long)&pGVar7[uVar10].mesh.indices + 8) = (pointer)0x0;
  __return_storage_ptr__->handle = pGVar7[uVar10].handle;
  pGVar7[uVar10].handle = 0;
  ppiVar1 = (pointer *)((long)&pGVar7[uVar10].mesh.indices + 8);
  *ppiVar1 = (pointer)0x0;
  ppiVar1[1] = (pointer)0x0;
  ppVVar2 = (pointer *)((long)&pGVar7[uVar10].mesh.vertices + 0x10);
  *ppVVar2 = (pointer)0x0;
  ppVVar2[1] = (pointer)0x0;
  *(undefined8 *)&pGVar7[uVar10].mesh.vertices = 0;
  *(pointer *)((long)&pGVar7[uVar10].mesh.vertices + 8) = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

T erase(StableVectorIndex index)
	{
		RMLUI_ASSERT(size_t(index) < elements.size() && !free_slots[size_t(index)]);
		free_slots[size_t(index)] = true;
		return std::exchange(elements[size_t(index)], T());
	}